

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void __thiscall QDateTime::Data::~Data(Data *this)

{
  int *piVar1;
  void *pvVar2;
  
  piVar1 = *(int **)this;
  if (((ulong)piVar1 & 1) == 0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = *(void **)this;
      if (pvVar2 != (void *)0x0) {
        QTimeZone::~QTimeZone((QTimeZone *)((long)pvVar2 + 0x18));
      }
      operator_delete(pvVar2,0x20);
      return;
    }
  }
  return;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}